

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.cpp
# Opt level: O0

void __thiscall
cppcms::anon_unknown_0::
base_handler<std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
::base_handler(base_handler<std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
               *this,string *expr,
              function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *handle,int a,int b,int c,int d,int e,int f)

{
  undefined4 in_ECX;
  string *in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  undefined4 in_stack_00000008;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000018;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *__x;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_ffffffffffffffc0;
  regex *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  
  __x = (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
         *)&stack0xffffffffffffffd0;
  booster::regex::regex((regex *)__x,in_RSI,0);
  option::option((option *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  booster::regex::~regex((regex *)&stack0xffffffffffffffd0);
  *in_RDI = &PTR__base_handler_0052bd70;
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::function(in_stack_ffffffffffffffc0,__x);
  *(undefined4 *)(in_RDI + 0xd) = in_ECX;
  *(undefined4 *)((long)in_RDI + 0x6c) = in_R8D;
  *(undefined4 *)(in_RDI + 0xe) = in_R9D;
  *(undefined4 *)((long)in_RDI + 0x74) = in_stack_00000008;
  *(undefined4 *)(in_RDI + 0xf) = in_stack_00000010;
  *(undefined4 *)((long)in_RDI + 0x7c) = in_stack_00000018;
  return;
}

Assistant:

base_handler(std::string expr,H handle,int a=0,int b=0,int c=0,int d=0,int e=0,int f=0)
				: option(expr),handle_(handle)
			{
				select_[0]=a;
				select_[1]=b;
				select_[2]=c;
				select_[3]=d;
				select_[4]=e;
				select_[5]=f;
			}